

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O2

VectorXd __thiscall LidarMeasurement::InitializeState(LidarMeasurement *this,int n)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  int in_EDX;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_00;
  VectorXd VVar4;
  Scalar local_18;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long)in_EDX);
  local_18 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_18);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
            (CONCAT44(in_register_00000034,n) + 0x18);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](this_00,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](this_00,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
  *pSVar3 = dVar1;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd LidarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(0.1);
    x(0) = measurements_[0];
    x(1) = measurements_[1];
    //x(0) = (fabs(measurements_[0]) < 0.01) ? 0.01 : measurements_[0];
    //x(1) = (fabs(measurements_[1]) < 0.01) ? 0.01 : measurements_[1];
    return x;
}